

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int set_image_col_types(ParseData *lParse,fitsfile *fptr,char *name,int bitpix,DataInfo *varInfo,
                       iteratorCol *colIter)

{
  int iVar1;
  double dVar2;
  double tzero;
  int istatus;
  double tscale;
  double local_98;
  int local_8c;
  double local_88 [11];
  
  if (bitpix < 0x10) {
    if ((bitpix == -0x40) || (bitpix == -0x20)) {
LAB_0012eac0:
      varInfo->type = 0x104;
      colIter->datatype = 0x52;
      return 0;
    }
    if (bitpix != 8) {
LAB_0012eb5f:
      snprintf((char *)local_88,0x50,"set_image_col_types: unrecognized image bitpix [%d]\n");
      ffpmsg((char *)local_88);
      lParse->status = 0x1b0;
      return 0x1b0;
    }
  }
  else if (bitpix != 0x10) {
    if (bitpix == 0x40) goto LAB_0012eac0;
    if (bitpix != 0x20) goto LAB_0012eb5f;
  }
  local_8c = 0;
  iVar1 = ffgky(fptr,0x52,"BZERO",&local_98,(char *)0x0,&local_8c);
  if (iVar1 != 0) {
    local_98 = 0.0;
  }
  local_8c = 0;
  iVar1 = ffgky(fptr,0x52,"BSCALE",local_88,(char *)0x0,&local_8c);
  if (iVar1 == 0) {
    dVar2 = local_88[0];
    if ((local_88[0] != 1.0) || (NAN(local_88[0]))) goto LAB_0012eb09;
  }
  else {
    local_88[0] = 1.0;
  }
  if (((local_98 == 0.0) && (!NAN(local_98))) || ((local_98 == 32768.0 && (!NAN(local_98))))) {
    varInfo->type = 0x103;
    colIter->datatype = 0x29;
    return 0;
  }
  dVar2 = 1.0;
LAB_0012eb09:
  varInfo->type = 0x104;
  colIter->datatype = 0x52;
  if (DEBUG_PIXFILTER != 0) {
    printf("use DOUBLE for %s with BSCALE=%g/BZERO=%g\n",dVar2,local_98,name);
  }
  return 0;
}

Assistant:

static int set_image_col_types (ParseData *lParse,
				fitsfile * fptr, const char * name, int bitpix,
				DataInfo * varInfo, iteratorCol *colIter) {

   int istatus;
   double tscale, tzero;
   char temp[80];

   switch (bitpix) {
      case BYTE_IMG:
      case SHORT_IMG:
      case LONG_IMG:
         istatus = 0;
         if (fits_read_key(fptr, TDOUBLE, "BZERO", &tzero, NULL, &istatus))
            tzero = 0.0;

         istatus = 0;
         if (fits_read_key(fptr, TDOUBLE, "BSCALE", &tscale, NULL, &istatus))
            tscale = 1.0;

         if (tscale == 1.0 && (tzero == 0.0 || tzero == 32768.0 )) {
            varInfo->type     = LONG;
            colIter->datatype = TLONG;
         }
         else {
            varInfo->type     = DOUBLE;
            colIter->datatype = TDOUBLE;
            if (DEBUG_PIXFILTER)
                printf("use DOUBLE for %s with BSCALE=%g/BZERO=%g\n",
                        name, tscale, tzero);
         }
         break;

      case LONGLONG_IMG:
      case FLOAT_IMG:
      case DOUBLE_IMG:
         varInfo->type     = DOUBLE;
         colIter->datatype = TDOUBLE;
         break;
      default:
         snprintf(temp, 80,"set_image_col_types: unrecognized image bitpix [%d]\n",
                bitpix);
         ffpmsg(temp);
         return lParse->status = PARSE_BAD_TYPE;
   }
   return 0;
}